

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blitter.cpp
# Opt level: O3

void __thiscall Amiga::Blitter<false>::set_data(Blitter<false> *this,int channel,uint16_t value)

{
  if (channel == 2) {
    this->c_data_ = value;
  }
  else {
    if (channel == 1) {
      this->b_data_ = value;
      return;
    }
    if (channel == 0) {
      this->a_data_ = value;
      return;
    }
  }
  return;
}

Assistant:

void Blitter<record_bus>::set_data(int channel, uint16_t value) {
	logger.info().append("Set data %d to %04x", channel, value);

	// Ugh, backed myself into a corner. TODO: clean.
	switch(channel) {
		case 0: a_data_ = value; break;
		case 1: b_data_ = value; break;
		case 2: c_data_ = value; break;
		default: break;
	}
}